

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void check_arguments(int argc,char **argv)

{
  ostream *poVar1;
  char *pcVar2;
  allocator local_39;
  string usage_instructions;
  
  std::__cxx11::string::string((string *)&usage_instructions,"Usage instructions: ",&local_39);
  std::__cxx11::string::append((char *)&usage_instructions);
  std::__cxx11::string::append((char *)&usage_instructions);
  if (argc == 3) {
    std::__cxx11::string::~string((string *)&usage_instructions);
    return;
  }
  if (argc == 1) {
    poVar1 = (ostream *)&std::cerr;
  }
  else {
    if (argc == 2) {
      pcVar2 = "Please include an output file.\n";
    }
    else {
      if (argc < 4) goto LAB_001105c9;
      pcVar2 = "Too many arguments.\n";
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,pcVar2);
  }
  poVar1 = std::operator<<(poVar1,(string *)&usage_instructions);
  std::endl<char,std::char_traits<char>>(poVar1);
LAB_001105c9:
  exit(1);
}

Assistant:

void check_arguments(int argc, char* argv[]) {
  string usage_instructions = "Usage instructions: ";
  usage_instructions += argv[0];
  usage_instructions += " path/to/input.txt output.txt";

  bool has_valid_args = false;

  // make sure the user has provided input and output files
  if (argc == 1) {
    cerr << usage_instructions << endl;
  } else if (argc == 2) {
    cerr << "Please include an output file.\n" << usage_instructions << endl;
  } else if (argc == 3) {
    has_valid_args = true;
  } else if (argc > 3) {
    cerr << "Too many arguments.\n" << usage_instructions << endl;
  }

  if (!has_valid_args) {
    exit(EXIT_FAILURE);
  }
}